

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledReturnTypeCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  ProfileId profileId;
  CallFlags flags;
  uint offset;
  Var target;
  RecyclableObject *function;
  FunctionBody *functionBody;
  AuxArray<unsigned_int> *local_40;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  target = GetRegAllowStackVar<unsigned_int>
                     (this,(playout->
                           super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                           ).super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                           .super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Function
                     );
  function = OP_CallGetFunc(this,target);
  flags = (playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
          callFlags;
  profileId = playout->profileId;
  if (((playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
       super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Options &
      CallIExtended_SpreadArgs) == CallIExtended_None) {
    local_40 = (AuxArray<unsigned_int> *)0x0;
  }
  else {
    offset = (playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>)
             .super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
             SpreadAuxOffset;
    functionBody = GetFunctionBody(this);
    local_40 = ByteCodeReader::ReadAuxArray<unsigned_int>(offset,functionBody);
  }
  OP_ProfileReturnTypeCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
            (this,playout,function,flags,profileId,local_40);
  return;
}

Assistant:

void OP_ProfiledReturnTypeCallIExtendedFlags(const unaligned OpLayoutDynamicProfile<T>* playout) { OP_ProfileReturnTypeCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)),  playout->callFlags, playout->profileId, (playout->Options & CallIExtended_SpreadArgs) ? m_reader.ReadAuxArray<uint32>(playout->SpreadAuxOffset, this->GetFunctionBody()) : nullptr); }